

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O0

void __thiscall
Reflection::StructImpl<Enterprise::Machine::Options>::limit_enum<Configurable::Display>
          (StructImpl<Enterprise::Machine::Options> *this,Display *t,...)

{
  char in_AL;
  ulong uVar1;
  size_type sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  reference rVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<bool,_std::allocator<bool>_>_>,_false,_true>,_bool>
  pVar4;
  int *local_1d8;
  undefined1 local_1b8 [16];
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<bool,_std::allocator<bool>_>_>,_true>
  local_108;
  undefined1 local_100;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<bool,_std::allocator<bool>_>_>
  local_f8;
  reference local_b0;
  int local_9c;
  uint local_98;
  int next;
  va_list list;
  allocator<bool> local_69;
  undefined1 local_68 [8];
  vector<bool,_std::allocator<bool>_> permitted_values;
  undefined1 local_38 [8];
  string name;
  Display *t_local;
  StructImpl<Enterprise::Machine::Options> *this_local;
  
  if (in_AL != '\0') {
    local_188 = in_XMM0_Qa;
    local_178 = in_XMM1_Qa;
    local_168 = in_XMM2_Qa;
    local_158 = in_XMM3_Qa;
    local_148 = in_XMM4_Qa;
    local_138 = in_XMM5_Qa;
    local_128 = in_XMM6_Qa;
    local_118 = in_XMM7_Qa;
  }
  local_1a8 = in_RDX;
  local_1a0 = in_RCX;
  local_198 = in_R8;
  local_190 = in_R9;
  name.field_2._8_8_ = t;
  name_of_abi_cxx11_((string *)local_38,this,t);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::allocator<bool>::allocator(&local_69);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_68,8,&local_69);
    std::allocator<bool>::~allocator(&local_69);
    list[0].overflow_arg_area = local_1b8;
    list[0]._0_8_ = &stack0x00000008;
    next = 0x30;
    local_98 = 0x10;
    while( true ) {
      if (local_98 < 0x29) {
        local_1d8 = (int *)((long)(int)local_98 + (long)list[0].overflow_arg_area);
        local_98 = local_98 + 8;
      }
      else {
        local_1d8 = (int *)list[0]._0_8_;
        list[0]._0_8_ = list[0]._0_8_ + 8;
      }
      local_9c = *local_1d8;
      if (local_9c < 0) break;
      sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)local_68);
      if (sVar2 <= (ulong)(long)local_9c) {
        sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)local_68);
        std::vector<bool,_std::allocator<bool>_>::resize
                  ((vector<bool,_std::allocator<bool>_> *)local_68,sVar2 * 2,false);
      }
      rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_68,(long)local_9c);
      local_b0 = rVar3;
      std::_Bit_reference::operator=(&local_b0,true);
    }
    std::make_pair<std::__cxx11::string_const&,std::vector<bool,std::allocator<bool>>&>
              (&local_f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (vector<bool,_std::allocator<bool>_> *)local_68);
    pVar4 = std::
            unordered_map<std::__cxx11::string,std::vector<bool,std::allocator<bool>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<bool,std::allocator<bool>>>>>
            ::emplace<std::pair<std::__cxx11::string,std::vector<bool,std::allocator<bool>>>>
                      ((unordered_map<std::__cxx11::string,std::vector<bool,std::allocator<bool>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<bool,std::allocator<bool>>>>>
                        *)&permitted_enum_values__abi_cxx11_,&local_f8);
    local_108._M_cur =
         (__node_type *)
         pVar4.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<bool,_std::allocator<bool>_>_>,_true>
         ._M_cur;
    local_100 = pVar4.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<bool,_std::allocator<bool>_>_>
    ::~pair(&local_f8);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_68);
    permitted_values.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._4_4_ = 0;
  }
  else {
    permitted_values.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void limit_enum(Type *t, ...) {
			const auto name = name_of(t);
			if(name.empty()) return;

			// The default vector size of '8' isn't especially scientific,
			// but I feel like it's a good choice.
			std::vector<bool> permitted_values(8);

			va_list list;
			va_start(list, t);
			while(true) {
				const int next = va_arg(list, int);
				if(next < 0) break;

				if(permitted_values.size() <= size_t(next)) {
					permitted_values.resize(permitted_values.size() << 1);
				}
				permitted_values[size_t(next)] = true;
			}
			va_end(list);

			permitted_enum_values_.emplace(std::make_pair(name, permitted_values));
		}